

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anna_hashmap.h
# Opt level: O1

pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::insert(pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,pair<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *value)

{
  _Fwd_list_node_base *p_Var1;
  pointer puVar2;
  bool bVar3;
  pointer pfVar4;
  anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *paVar5;
  _Fwd_list_node_base *p_Var6;
  _Fwd_list_node_base *p_Var7;
  size_t h;
  ulong uVar8;
  _Fwd_list_node_base *p_Var9;
  int iVar10;
  _Fwd_list_node_base *__to;
  long lVar11;
  _Fwd_list_impl _Var12;
  undefined1 auVar13 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  lVar11 = (long)(this->table_).
                 super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->table_).
                 super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (10 < this->size_ / (ulong)(lVar11 >> 3)) {
    rehash(this,lVar11 >> 2);
  }
  uVar8 = 0;
  lVar11 = 0;
  do {
    uVar8 = uVar8 ^ (long)*(int *)((long)(value->first)._M_elems + lVar11);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  pfVar4 = (this->table_).
           super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = 0;
  uVar8 = uVar8 % (ulong)((long)(this->table_).
                                super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar4 >> 3) &
          0xffffffff;
  p_Var1 = (_Fwd_list_node_base *)(pfVar4 + uVar8);
  paVar5 = (__return_storage_ptr__->first).hashmap_;
  bVar3 = __return_storage_ptr__->second;
  _Var12._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var1;
  while( true ) {
    _Var12._M_head._M_next =
         (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var12._M_head._M_next)->_M_next;
    if ((_Fwd_list_impl)_Var12._M_head._M_next == (_Fwd_list_impl)0x0) {
      (__return_storage_ptr__->first).bucket_ = (__return_storage_ptr__->first).bucket_;
      (__return_storage_ptr__->first).position_ = (__return_storage_ptr__->first).position_;
      __return_storage_ptr__->second = bVar3;
      (__return_storage_ptr__->first).hashmap_ = paVar5;
      p_Var6 = *(_Fwd_list_node_base **)(value->first)._M_elems;
      p_Var7 = *(_Fwd_list_node_base **)((value->first)._M_elems + 2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,&value->second);
      p_Var9 = (_Fwd_list_node_base *)operator_new(0x30);
      p_Var9->_M_next = (_Fwd_list_node_base *)0x0;
      p_Var9[1]._M_next = p_Var6;
      p_Var9[2]._M_next = p_Var7;
      p_Var9[3]._M_next = (_Fwd_list_node_base *)local_48._0_8_;
      p_Var9[4]._M_next = (_Fwd_list_node_base *)local_48._8_8_;
      p_Var9[5]._M_next = (_Fwd_list_node_base *)local_38;
      local_38 = (pointer)0x0;
      local_48 = (undefined1  [16])0x0;
      p_Var9->_M_next = p_Var1->_M_next;
      p_Var1->_M_next = p_Var9;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      this->size_ = this->size_ + 1;
      puVar2 = (this->bucket_sizes_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      *puVar2 = *puVar2 + 1;
      (__return_storage_ptr__->first).hashmap_ = this;
      (__return_storage_ptr__->first).bucket_ = uVar8;
      (__return_storage_ptr__->first).position_ = 0;
      __return_storage_ptr__->second = true;
      return __return_storage_ptr__;
    }
    auVar13[0] = -((char)(value->first)._M_elems[0] == *(char *)((long)_Var12._M_head._M_next + 8));
    auVar13[1] = -(*(char *)((long)(value->first)._M_elems + 1) ==
                  *(char *)((long)_Var12._M_head._M_next + 9));
    auVar13[2] = -(*(char *)((long)(value->first)._M_elems + 2) ==
                  *(char *)((long)_Var12._M_head._M_next + 10));
    auVar13[3] = -(*(char *)((long)(value->first)._M_elems + 3) ==
                  *(char *)((long)_Var12._M_head._M_next + 0xb));
    auVar13[4] = -((char)(value->first)._M_elems[1] == *(char *)((long)_Var12._M_head._M_next + 0xc)
                  );
    auVar13[5] = -(*(char *)((long)(value->first)._M_elems + 5) ==
                  *(char *)((long)_Var12._M_head._M_next + 0xd));
    auVar13[6] = -(*(char *)((long)(value->first)._M_elems + 6) ==
                  *(char *)((long)_Var12._M_head._M_next + 0xe));
    auVar13[7] = -(*(char *)((long)(value->first)._M_elems + 7) ==
                  *(char *)((long)_Var12._M_head._M_next + 0xf));
    auVar13[8] = -((char)(value->first)._M_elems[2] ==
                  *(char *)((long)_Var12._M_head._M_next + 0x10));
    auVar13[9] = -(*(char *)((long)(value->first)._M_elems + 9) ==
                  *(char *)((long)_Var12._M_head._M_next + 0x11));
    auVar13[10] = -(*(char *)((long)(value->first)._M_elems + 10) ==
                   *(char *)((long)_Var12._M_head._M_next + 0x12));
    auVar13[0xb] = -(*(char *)((long)(value->first)._M_elems + 0xb) ==
                    *(char *)((long)_Var12._M_head._M_next + 0x13));
    auVar13[0xc] = -((char)(value->first)._M_elems[3] ==
                    *(char *)((long)_Var12._M_head._M_next + 0x14));
    auVar13[0xd] = -(*(char *)((long)(value->first)._M_elems + 0xd) ==
                    *(char *)((long)_Var12._M_head._M_next + 0x15));
    auVar13[0xe] = -(*(char *)((long)(value->first)._M_elems + 0xe) ==
                    *(char *)((long)_Var12._M_head._M_next + 0x16));
    auVar13[0xf] = -(*(char *)((long)(value->first)._M_elems + 0xf) ==
                    *(char *)((long)_Var12._M_head._M_next + 0x17));
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) == 0xffff) break;
    iVar10 = iVar10 + 1;
  }
  (__return_storage_ptr__->first).bucket_ = uVar8;
  (__return_storage_ptr__->first).position_ = (long)iVar10;
  __return_storage_ptr__->second = false;
  (__return_storage_ptr__->first).hashmap_ = this;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<K, V>& value) {
        if (size_ / table_.size() > MAX_AVERAGE_BUCKET_SIZE)
            rehash(2 * table_.size());

        const K& key = value.first;
        const unsigned bucket = anna_hash<K>::hash(key) % table_.size();

        int position = 0;
        for (const auto& kv : table_[bucket]) {
            if (kv.first == key) {
                return {iterator(this, bucket, position), false};
            }
            ++position;
        }

        table_[bucket].push_front(value);
        ++size_;
        ++bucket_sizes_[bucket];

        return {iterator(this, bucket, 0), true};
    }